

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O1

Comparison __thiscall
DP::SimpleCongruenceClosure::ConstOrderingComparator::compare
          (ConstOrderingComparator *this,uint c1,uint c2)

{
  ConstInfo *pCVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  Comparison CVar5;
  int iVar6;
  uint uVar7;
  
  pCVar1 = this->_cInfos->_array;
  uVar2 = pCVar1[c1].normalForm._content;
  uVar3 = pCVar1[c2].normalForm._content;
  uVar7 = (uint)uVar3 & 3;
  if (((uint)uVar2 & 3) == 2) {
    return -(uint)(uVar7 != 2);
  }
  CVar5 = GREATER;
  if ((uVar7 != 2) &&
     ((uVar4 = *(ulong *)(uVar2 + 0x28), (uVar4 & 0x20) == 0 ||
      (CVar5 = LESS, (*(byte *)(uVar3 + 0x28) & 0x20) != 0)))) {
    if (((uVar4 & 0x20) == 0) && ((*(ulong *)(uVar3 + 0x28) & 0x20) != 0)) {
      return GREATER;
    }
    iVar6 = (*this->_ord->_vptr_Ordering[3])();
    return *(Comparison *)(") and (" + (long)iVar6 * 4 + 7);
  }
  return CVar5;
}

Assistant:

Comparison compare(unsigned c1, unsigned c2)
  {
    TermList c1NF = _cInfos[c1].normalForm;
    TermList c2NF = _cInfos[c2].normalForm;
    
    // we don't care about the order of partial applications 
    // as long as they are smaller than the proper terms
    
    if (c1NF.isEmpty()) {
      if (c2NF.isEmpty()) {
        return EQUAL;
      } else {
        return LESS;
      }
    } else {
      if (c2NF.isEmpty()) {
        return GREATER;
      } else {
        // We should not be comparing sorts with terms via the ordering
        if(c1NF.term()->isSort() && !c2NF.term()->isSort()){
          return LESS;
        } else if(c2NF.term()->isSort() && !c1NF.term()->isSort()) {
          return GREATER;
        }
        // two proper terms
        switch(_ord.compare(c1NF,c2NF)) {
          case Ordering::Result::GREATER:
            return GREATER;    
          case Ordering::Result::LESS:
            return LESS;
          case Ordering::Result::EQUAL:
            return EQUAL;    
          default:
            ASSERTION_VIOLATION;
        }
      }
    }
  }